

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxconvenience.cpp
# Opt level: O1

void qglx_surfaceFormatFromVisualInfo
               (QSurfaceFormat *format,Display *display,XVisualInfo *visualInfo,int flags)

{
  long in_FS_OFFSET;
  int srgbCapable;
  int stereo;
  int sampleCount;
  int sampleBuffers;
  int stencilSize;
  int depthSize;
  int alphaSize;
  int blueSize;
  int greenSize;
  int redSize;
  QColorSpace local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_50 = 0;
  local_54 = 0;
  local_58 = 0;
  local_5c = 0;
  local_60 = 0;
  glXGetConfig(display,visualInfo,8);
  glXGetConfig(display,visualInfo,9,&local_40);
  glXGetConfig(display,visualInfo,10,&local_44);
  glXGetConfig(display,visualInfo,0xb,&local_48);
  glXGetConfig(display,visualInfo,0xc,&local_4c);
  glXGetConfig(display,visualInfo,0xd,&local_50);
  glXGetConfig(display,visualInfo,100000,&local_54);
  glXGetConfig(display,visualInfo,6,&local_5c);
  if ((flags & 1U) != 0) {
    glXGetConfig(display,visualInfo,0x20b2,&local_60);
  }
  QSurfaceFormat::setRedBufferSize(format,local_3c);
  QSurfaceFormat::setGreenBufferSize(format,local_40);
  QSurfaceFormat::setBlueBufferSize(format,local_44);
  QSurfaceFormat::setAlphaBufferSize(format,local_48);
  QSurfaceFormat::setDepthBufferSize(format,local_4c);
  QSurfaceFormat::setStencilBufferSize(format,local_50);
  if (local_54 != 0) {
    glXGetConfig(display,visualInfo,0x186a1,&local_58);
    QSurfaceFormat::setSamples(format,local_58);
  }
  if (local_60 == 0) {
    local_68.d_ptr.d.ptr =
         (QExplicitlySharedDataPointer<QColorSpacePrivate>)
         (totally_ordered_wrapper<QColorSpacePrivate_*>)0x0;
  }
  else {
    QColorSpace::QColorSpace(&local_68,SRgb);
  }
  QSurfaceFormat::setColorSpace(format,&local_68);
  QColorSpace::~QColorSpace(&local_68);
  QSurfaceFormat::setStereo(format,local_5c != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qglx_surfaceFormatFromVisualInfo(QSurfaceFormat *format, Display *display, XVisualInfo *visualInfo, int flags)
{
    int redSize     = 0;
    int greenSize   = 0;
    int blueSize    = 0;
    int alphaSize   = 0;
    int depthSize   = 0;
    int stencilSize = 0;
    int sampleBuffers = 0;
    int sampleCount = 0;
    int stereo      = 0;
    int srgbCapable = 0;

    glXGetConfig(display, visualInfo, GLX_RED_SIZE,     &redSize);
    glXGetConfig(display, visualInfo, GLX_GREEN_SIZE,   &greenSize);
    glXGetConfig(display, visualInfo, GLX_BLUE_SIZE,    &blueSize);
    glXGetConfig(display, visualInfo, GLX_ALPHA_SIZE,   &alphaSize);
    glXGetConfig(display, visualInfo, GLX_DEPTH_SIZE,   &depthSize);
    glXGetConfig(display, visualInfo, GLX_STENCIL_SIZE, &stencilSize);
    glXGetConfig(display, visualInfo, GLX_SAMPLE_BUFFERS_ARB, &sampleBuffers);
    glXGetConfig(display, visualInfo, GLX_STEREO,       &stereo);
    if (flags & QGLX_SUPPORTS_SRGB)
        glXGetConfig(display, visualInfo, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB, &srgbCapable);

    format->setRedBufferSize(redSize);
    format->setGreenBufferSize(greenSize);
    format->setBlueBufferSize(blueSize);
    format->setAlphaBufferSize(alphaSize);
    format->setDepthBufferSize(depthSize);
    format->setStencilBufferSize(stencilSize);
    if (sampleBuffers) {
        glXGetConfig(display, visualInfo, GLX_SAMPLES_ARB, &sampleCount);
        format->setSamples(sampleCount);
    }
    if (srgbCapable)
        format->setColorSpace(QColorSpace::SRgb);
    else
        format->setColorSpace(QColorSpace());

    format->setStereo(stereo);
}